

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QFbWindow_*>::move(QList<QFbWindow_*> *this,qsizetype from,qsizetype to)

{
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QFbWindow_*> *in_RDI;
  QFbWindow **unaff_retaddr;
  QFbWindow **b;
  QArrayDataPointer<QFbWindow_*> *__last;
  
  if (in_RSI != in_RDX) {
    __last = in_RDI;
    detach((QList<QFbWindow_*> *)0x124dba);
    QArrayDataPointer<QFbWindow_*>::operator->(in_RDI);
    QArrayDataPointer<QFbWindow_*>::begin((QArrayDataPointer<QFbWindow_*> *)0x124dcb);
    if (in_RSI < in_RDX) {
      std::_V2::rotate<QFbWindow**>(b,unaff_retaddr,(QFbWindow **)__last);
    }
    else {
      std::_V2::rotate<QFbWindow**>(b,unaff_retaddr,(QFbWindow **)__last);
    }
  }
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }